

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O1

void setShiftPermute(int s)

{
  bool bVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int ss [6];
  
  piVar2 = permute;
  ss[0] = 0;
  lVar4 = 1;
  do {
    next = next * 0x41c64e6d + 0x3039;
    ss[lVar4] = ((uint)(next >> 0x10) & 0x7fff) % 200;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  uVar6 = (ulong)(uint)numOfVariables;
  if (0 < numOfVariables) {
    uVar5 = 0;
    do {
      piVar2[uVar5 + 1] =
           (groupSize *
            ss[(int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) %
                    (long)groupSize)] + (int)uVar5) % (int)uVar6 + 1;
      uVar6 = (ulong)numOfVariables;
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)uVar6);
  }
  piVar3 = unpermute;
  piVar2 = permute;
  if (0 < numOfVariables) {
    lVar4 = 1;
    do {
      piVar3[piVar2[lVar4]] = (int)lVar4;
      bVar1 = lVar4 < numOfVariables;
      lVar4 = lVar4 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void setShiftPermute (int s)
{
	int v;
	int ss[6];
	ss[0] = 0;
	for (v=1;v<=5;v++)
		ss[v] = myrand()%200;



	for (v=1;v<=numOfVariables;v++)
		permute[v] = 1 + (v-1+groupSize*ss[(v-1)%groupSize] )%numOfVariables;

	for (v=1;v<=numOfVariables;v++)
		unpermute[permute[v]] = v;

}